

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::SetupDescriptorScriptPubKeyMan
          (CWallet *this,WalletBatch *batch,CExtKey *master_key,OutputType *output_type,
          bool internal)

{
  long lVar1;
  uint256 id_00;
  bool bVar2;
  int iVar3;
  DescriptorScriptPubKeyMan *this_00;
  runtime_error *prVar4;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *local_88;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint256 id;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (DescriptorScriptPubKeyMan *)operator_new(0x278);
  DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
            (this_00,&this->super_WalletStorage,this->m_keypool_size);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar2 = IsLocked(this);
    if (bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"SetupDescriptorScriptPubKeyMan",&local_79);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                     &local_78,": Wallet is locked, cannot setup new descriptors");
      std::runtime_error::runtime_error(prVar4,(string *)&id);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_009ab618;
    }
    iVar3 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[4])(this_00,&this->vMasterKey);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[5])
                        (this_00,&this->vMasterKey,batch);
      if ((char)iVar3 == '\0') {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"SetupDescriptorScriptPubKeyMan",&local_79);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                       &local_78,": Could not encrypt new descriptors");
        std::runtime_error::runtime_error(prVar4,(string *)&id);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_009ab618;
      }
    }
  }
  DescriptorScriptPubKeyMan::SetupDescriptorGeneration
            (this_00,batch,master_key,*output_type,internal);
  (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&id,this_00);
  local_88 = this_00;
  AddScriptPubKeyMan(this,&id,(unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                               )&local_88);
  if (local_88 != (DescriptorScriptPubKeyMan *)0x0) {
    (*(local_88->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
  }
  local_88 = (DescriptorScriptPubKeyMan *)0x0;
  id_00.super_base_blob<256U>.m_data._M_elems[8] = id.super_base_blob<256U>.m_data._M_elems[8];
  id_00.super_base_blob<256U>.m_data._M_elems[9] = id.super_base_blob<256U>.m_data._M_elems[9];
  id_00.super_base_blob<256U>.m_data._M_elems[10] = id.super_base_blob<256U>.m_data._M_elems[10];
  id_00.super_base_blob<256U>.m_data._M_elems[0xb] = id.super_base_blob<256U>.m_data._M_elems[0xb];
  id_00.super_base_blob<256U>.m_data._M_elems[0xc] = id.super_base_blob<256U>.m_data._M_elems[0xc];
  id_00.super_base_blob<256U>.m_data._M_elems[0xd] = id.super_base_blob<256U>.m_data._M_elems[0xd];
  id_00.super_base_blob<256U>.m_data._M_elems[0xe] = id.super_base_blob<256U>.m_data._M_elems[0xe];
  id_00.super_base_blob<256U>.m_data._M_elems[0xf] = id.super_base_blob<256U>.m_data._M_elems[0xf];
  id_00.super_base_blob<256U>.m_data._M_elems[0] = id.super_base_blob<256U>.m_data._M_elems[0];
  id_00.super_base_blob<256U>.m_data._M_elems[1] = id.super_base_blob<256U>.m_data._M_elems[1];
  id_00.super_base_blob<256U>.m_data._M_elems[2] = id.super_base_blob<256U>.m_data._M_elems[2];
  id_00.super_base_blob<256U>.m_data._M_elems[3] = id.super_base_blob<256U>.m_data._M_elems[3];
  id_00.super_base_blob<256U>.m_data._M_elems[4] = id.super_base_blob<256U>.m_data._M_elems[4];
  id_00.super_base_blob<256U>.m_data._M_elems[5] = id.super_base_blob<256U>.m_data._M_elems[5];
  id_00.super_base_blob<256U>.m_data._M_elems[6] = id.super_base_blob<256U>.m_data._M_elems[6];
  id_00.super_base_blob<256U>.m_data._M_elems[7] = id.super_base_blob<256U>.m_data._M_elems[7];
  id_00.super_base_blob<256U>.m_data._M_elems[0x10] = id.super_base_blob<256U>.m_data._M_elems[0x10]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x11] = id.super_base_blob<256U>.m_data._M_elems[0x11]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x12] = id.super_base_blob<256U>.m_data._M_elems[0x12]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x13] = id.super_base_blob<256U>.m_data._M_elems[0x13]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x14] = id.super_base_blob<256U>.m_data._M_elems[0x14]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x15] = id.super_base_blob<256U>.m_data._M_elems[0x15]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x16] = id.super_base_blob<256U>.m_data._M_elems[0x16]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x17] = id.super_base_blob<256U>.m_data._M_elems[0x17]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x18] = id.super_base_blob<256U>.m_data._M_elems[0x18]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x19] = id.super_base_blob<256U>.m_data._M_elems[0x19]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1a] = id.super_base_blob<256U>.m_data._M_elems[0x1a]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1b] = id.super_base_blob<256U>.m_data._M_elems[0x1b]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1c] = id.super_base_blob<256U>.m_data._M_elems[0x1c]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1d] = id.super_base_blob<256U>.m_data._M_elems[0x1d]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1e] = id.super_base_blob<256U>.m_data._M_elems[0x1e]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x1f] = id.super_base_blob<256U>.m_data._M_elems[0x1f]
  ;
  AddActiveScriptPubKeyManWithDb(this,batch,id_00,*output_type,internal);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
LAB_009ab618:
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan& CWallet::SetupDescriptorScriptPubKeyMan(WalletBatch& batch, const CExtKey& master_key, const OutputType& output_type, bool internal)
{
    AssertLockHeld(cs_wallet);
    auto spk_manager = std::unique_ptr<DescriptorScriptPubKeyMan>(new DescriptorScriptPubKeyMan(*this, m_keypool_size));
    if (IsCrypted()) {
        if (IsLocked()) {
            throw std::runtime_error(std::string(__func__) + ": Wallet is locked, cannot setup new descriptors");
        }
        if (!spk_manager->CheckDecryptionKey(vMasterKey) && !spk_manager->Encrypt(vMasterKey, &batch)) {
            throw std::runtime_error(std::string(__func__) + ": Could not encrypt new descriptors");
        }
    }
    spk_manager->SetupDescriptorGeneration(batch, master_key, output_type, internal);
    DescriptorScriptPubKeyMan* out = spk_manager.get();
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
    AddActiveScriptPubKeyManWithDb(batch, id, output_type, internal);
    return *out;
}